

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_table.c
# Opt level: O0

void int_cleanup_cb_doall(ENGINE_PILE *p)

{
  ENGINE *in_RDI;
  
  if (in_RDI != (ENGINE *)0x0) {
    sk_ENGINE_free((stack_st_ENGINE *)0x41308b);
    if (in_RDI->rsa_meth != (RSA_METHOD *)0x0) {
      engine_unlocked_finish(in_RDI,0);
    }
    CRYPTO_free(in_RDI);
  }
  return;
}

Assistant:

static void int_cleanup_cb_doall(ENGINE_PILE *p)
{
    if (p == NULL)
        return;
    sk_ENGINE_free(p->sk);
    if (p->funct)
        engine_unlocked_finish(p->funct, 0);
    OPENSSL_free(p);
}